

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.cpp
# Opt level: O1

void BrotliCompressFragmentTwoPassImpl16
               (BrotliTwoPassArena *s,uint8_t *input,size_t input_size,int is_last,
               uint32_t *command_buf,uint8_t *literal_buf,int *table,size_t *storage_ix,
               uint8_t *storage)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *s1_orig;
  uint *input_size_00;
  uint *puVar6;
  long lVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  undefined4 in_register_0000000c;
  uint32_t *commands;
  ulong *puVar12;
  ulong *puVar13;
  uint *input_00;
  uint *__src;
  uint *puVar14;
  uint *puVar15;
  ulong *puVar16;
  uint uVar17;
  uint *puVar18;
  ulong uVar19;
  uint *puVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  int local_9c;
  uint *local_98;
  uint32_t *local_90;
  long local_38;
  
  commands = (uint32_t *)CONCAT44(in_register_0000000c,is_last);
  input_00 = (uint *)input;
  if (input_size != 0) {
    do {
      input_size_00 = (uint *)0x20000;
      if (input_size < (uint *)0x20000) {
        input_size_00 = (uint *)input_size;
      }
      puVar6 = (uint *)((long)input_size_00 + (long)input_00);
      __src = input_00;
      local_98 = commands;
      local_90 = command_buf;
      if ((uint *)0xf < input_size) {
        puVar18 = (uint *)(input_size + -0x10);
        if ((uint *)((long)input_size_00 + -6) < (uint *)(input_size + -0x10)) {
          puVar18 = (uint *)((long)input_size_00 + -6);
        }
        puVar18 = (uint *)((long)puVar18 + (long)input_00);
        puVar14 = (uint *)((long)input_00 + 1);
        uVar22 = (ulong)(*(long *)((long)input_00 + 1) * 0x1e35a7bd0000) >> 0x30;
        local_9c = -1;
        puVar20 = (uint *)input_size;
LAB_01c50ecf:
        uVar9 = 0x20;
        do {
          puVar15 = (uint *)((ulong)(uVar9 >> 5) + (long)puVar14);
          iVar21 = (int)input;
          iVar10 = (int)puVar14;
          if (puVar18 < puVar15) {
            iVar11 = 7;
          }
          else {
            uVar23 = (ulong)(*(long *)puVar15 * 0x1e35a7bd0000) >> 0x30;
            if ((((*puVar14 == *(uint *)((long)puVar14 + -(long)local_9c)) &&
                 (puVar20 = (uint *)(-(long)local_9c + (long)puVar14),
                 (char)puVar14[1] == (char)puVar20[1])) &&
                (*(char *)((long)puVar14 + 5) == *(char *)((long)puVar20 + 5))) && (0 < local_9c)) {
              *(int *)(literal_buf + uVar22 * 4) = iVar10 - iVar21;
              iVar11 = 5;
              uVar22 = uVar23;
            }
            else {
              puVar20 = (uint *)(input + *(int *)(literal_buf + uVar22 * 4));
              *(int *)(literal_buf + uVar22 * 4) = iVar10 - iVar21;
              iVar11 = 0;
              uVar22 = uVar23;
            }
          }
          if (iVar11 == 5) {
LAB_01c50f76:
            if ((long)puVar14 - (long)puVar20 < 0x3fff1) goto LAB_01c50f99;
          }
          else {
            if (iVar11 != 0) goto LAB_01c51551;
            if (((*puVar14 == *puVar20) && ((char)puVar14[1] == (char)puVar20[1])) &&
               (*(char *)((long)puVar14 + 5) == *(char *)((long)puVar20 + 5))) goto LAB_01c50f76;
          }
          uVar9 = uVar9 + 1;
          puVar14 = puVar15;
        } while( true );
      }
LAB_01c51573:
      if (__src < puVar6) {
        uVar9 = (uint)((long)puVar6 - (long)__src);
        if (5 < uVar9) {
          if (uVar9 < 0x82) {
            uVar9 = uVar9 - 2;
            uVar4 = 0x1f;
            if (uVar9 != 0) {
              for (; uVar9 >> uVar4 == 0; uVar4 = uVar4 - 1) {
              }
            }
            bVar8 = (char)(uVar4 ^ 0xffffffe0) + 0x1f;
            uVar5 = uVar9 >> (bVar8 & 0x1f);
            uVar9 = (uVar9 - (uVar5 << (bVar8 & 0x1f))) * 0x100 |
                    uVar5 + (uVar4 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (uVar9 < 0x842) {
            uVar4 = 0x1f;
            if (uVar9 - 0x42 != 0) {
              for (; uVar9 - 0x42 >> uVar4 == 0; uVar4 = uVar4 - 1) {
              }
            }
            uVar9 = (((-1 << ((byte)uVar4 & 0x1f)) + uVar9 + -0x42) * 0x100 - (uVar4 ^ 0x1f)) + 0x29
            ;
          }
          else {
            iVar10 = uVar9 * 0x100;
            if (uVar9 < 0x1842) {
              uVar9 = iVar10 - 0x841eb;
            }
            else if (uVar9 < 0x5842) {
              uVar9 = iVar10 - 0x1841ea;
            }
            else {
              uVar9 = iVar10 - 0x5841e9;
            }
          }
        }
        *local_98 = uVar9;
        local_98 = local_98 + 1;
        uVar22 = (long)puVar6 - (long)__src & 0xffffffff;
        switchD_01602a8a::default(local_90,__src,uVar22);
        local_90 = (uint32_t *)((long)local_90 + uVar22);
      }
      iVar10 = ShouldCompress(s,(uint8_t *)input_00,(size_t)input_size_00,
                              (long)local_90 - (long)command_buf);
      if (iVar10 == 0) {
        BrotliStoreMetaBlockHeader((size_t)input_size_00,1,(size_t *)table,(uint8_t *)storage_ix);
        iVar10 = *table;
        *(ulong *)table = (ulong)(iVar10 + 7U & 0xfffffff8);
        switchD_01602a8a::default
                  ((void *)((ulong)(iVar10 + 7U >> 3) + (long)storage_ix),input_00,
                   (size_t)input_size_00);
        uVar22 = (long)input_size_00 * 8 + *(long *)table;
        *(ulong *)table = uVar22;
        *(undefined1 *)((long)storage_ix + (uVar22 >> 3)) = 0;
      }
      else {
        BrotliStoreMetaBlockHeader((size_t)input_size_00,0,(size_t *)table,(uint8_t *)storage_ix);
        uVar22 = *(ulong *)table;
        uVar23 = uVar22 >> 3;
        *(ulong *)((long)storage_ix + uVar23) = (ulong)*(byte *)((long)storage_ix + uVar23);
        *(ulong *)table = uVar22 + 0xd;
        StoreCommands(s,(uint8_t *)command_buf,(long)local_90 - (long)command_buf,commands,
                      (long)local_98 - (long)commands >> 2,(size_t *)table,(uint8_t *)storage_ix);
      }
      input_size = input_size - (long)input_size_00;
      input_00 = puVar6;
    } while ((uint *)input_size != (uint *)0x0);
  }
  return;
LAB_01c50f99:
  puVar1 = (ulong *)((long)puVar20 + 6);
  puVar13 = (ulong *)((long)puVar14 + 6);
  puVar12 = puVar1;
  for (uVar23 = (long)puVar6 + (-6 - (long)puVar14); 7 < uVar23; uVar23 = uVar23 - 8) {
    uVar19 = *puVar13;
    uVar2 = *puVar12;
    if (uVar19 == uVar2) {
      puVar12 = puVar12 + 1;
    }
    else {
      uVar3 = 0;
      if ((uVar2 ^ uVar19) != 0) {
        for (; ((uVar2 ^ uVar19) >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      local_38 = (long)puVar12 + ((uVar3 >> 3 & 0x1fffffff) - (long)puVar1);
    }
    if (uVar19 != uVar2) goto LAB_01c51026;
    puVar13 = puVar13 + 1;
  }
  puVar16 = puVar12;
  if (uVar23 != 0) {
    puVar16 = (ulong *)((long)puVar12 + uVar23);
    uVar19 = 0;
    do {
      if (*(char *)((long)puVar12 + uVar19) != *(char *)((long)puVar13 + uVar19)) {
        puVar16 = (ulong *)((long)puVar12 + uVar19);
        break;
      }
      uVar19 = uVar19 + 1;
    } while (uVar23 != uVar19);
  }
  local_38 = (long)puVar16 - (long)puVar1;
LAB_01c51026:
  uVar4 = iVar10 - (int)__src;
  uVar9 = uVar4;
  if (5 < uVar4) {
    if (uVar4 < 0x82) {
      uVar5 = uVar4 - 2;
      uVar9 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      bVar8 = (char)(uVar9 ^ 0xffffffe0) + 0x1f;
      uVar17 = uVar5 >> (bVar8 & 0x1f);
      uVar9 = (uVar5 - (uVar17 << (bVar8 & 0x1f))) * 0x100 |
              uVar17 + (uVar9 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar4 < 0x842) {
      uVar9 = 0x1f;
      if (uVar4 - 0x42 != 0) {
        for (; uVar4 - 0x42 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = (((-1 << ((byte)uVar9 & 0x1f)) + uVar4 + -0x42) * 0x100 - (uVar9 ^ 0x1f)) + 0x29;
    }
    else {
      iVar10 = uVar4 * 0x100;
      if (uVar4 < 0x1842) {
        uVar9 = iVar10 - 0x841eb;
      }
      else if (uVar4 < 0x5842) {
        uVar9 = iVar10 - 0x1841ea;
      }
      else {
        uVar9 = iVar10 - 0x5841e9;
      }
    }
  }
  *local_98 = uVar9;
  switchD_01602a8a::default(local_90,__src,(long)(int)uVar4);
  uVar9 = 0x40;
  iVar10 = (int)((long)puVar14 - (long)puVar20);
  if (local_9c != iVar10) {
    uVar5 = iVar10 + 3;
    uVar9 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    bVar8 = 0x1e - (char)(uVar9 ^ 0x1f);
    bVar24 = (uVar5 >> (bVar8 & 0x1f) & 1) != 0;
    uVar9 = (uint)bVar24 +
            ((uVar5 - (bVar24 + 2 << (bVar8 & 0x1f))) * 0x100 | (uVar9 ^ 0x1f) * 2 ^ 0x3e) + 0x4c;
    local_9c = iVar10;
  }
  uVar23 = local_38 + 6;
  local_98[1] = uVar9;
  if (uVar23 < 0xc) {
    local_98[2] = (int)uVar23 + 0x14;
    lVar7 = 0xc;
    goto LAB_01c511ec;
  }
  if (uVar23 < 0x48) {
    uVar9 = 0x1f;
    uVar5 = (uint)(local_38 - 2U);
    if (uVar5 != 0) {
      for (; uVar5 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    bVar8 = (char)(uVar9 ^ 0xffffffe0) + 0x1f;
    uVar23 = local_38 - 2U >> (bVar8 & 0x3f);
    local_98[2] = (uVar5 - (int)(uVar23 << (bVar8 & 0x3f))) * 0x100 |
                  (int)uVar23 + (uVar9 ^ 0xffffffe0) * 2 + 0x5a;
    lVar7 = 0xc;
    goto LAB_01c511ec;
  }
  if (uVar23 < 0x88) {
    uVar9 = ((uint)(local_38 - 2U) & 0x1f) << 8 | (int)(local_38 - 2U >> 5) + 0x36U;
LAB_01c511db:
    local_98[2] = uVar9;
  }
  else {
    if (0x847 < uVar23) {
      uVar9 = (int)uVar23 * 0x100 - 0x847c1;
      goto LAB_01c511db;
    }
    uVar9 = (int)local_38 - 0x42;
    iVar10 = 0x1f;
    if (uVar9 != 0) {
      for (; uVar9 >> iVar10 == 0; iVar10 = iVar10 + -1) {
      }
    }
    local_98[2] = ((int)(-1L << ((byte)iVar10 & 0x3f)) + (int)local_38 + -0x42) * 0x100 + iVar10 +
                  0x34;
  }
  local_98[3] = 0x40;
  lVar7 = 0x10;
LAB_01c511ec:
  __src = (uint *)((long)puVar14 + local_38 + 6);
  if (__src < puVar18) {
    uVar23 = *(ulong *)((long)puVar14 + local_38 + 1);
    iVar10 = (int)__src - iVar21;
    *(int *)(literal_buf + (uVar23 * 0x1e35a7bd0000 >> 0x30) * 4) = iVar10 + -5;
    *(int *)(literal_buf + ((uVar23 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x30) * 4) = iVar10 + -4;
    *(int *)(literal_buf + ((uVar23 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x30) * 4) = iVar10 + -3;
    uVar23 = *(ulong *)((long)puVar14 + local_38 + 4);
    uVar19 = (uVar23 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x30;
    *(int *)(literal_buf + (uVar23 * 0x1e35a7bd0000 >> 0x30) * 4) = iVar10 + -2;
    *(int *)(literal_buf + ((uVar23 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x30) * 4) = iVar10 + -1;
    puVar20 = (uint *)(input + *(int *)(literal_buf + uVar19 * 4));
    *(int *)(literal_buf + uVar19 * 4) = iVar10;
    uVar23 = 0;
  }
  else {
    uVar23 = 7;
  }
  local_90 = (uint32_t *)((long)local_90 + (long)(int)uVar4);
  local_98 = (uint *)((long)local_98 + lVar7);
  puVar14 = __src;
  if (__src < puVar18) {
    lVar7 = (long)__src - (long)puVar20;
    if ((lVar7 < 0x3fff1) && (*__src == *puVar20)) {
      while ((iVar10 = (int)lVar7, (char)__src[1] == (char)puVar20[1] &&
             (*(char *)((long)__src + 5) == *(char *)((long)puVar20 + 5)))) {
        puVar1 = (ulong *)((long)puVar20 + 6);
        puVar13 = (ulong *)((long)__src + 6);
        puVar12 = puVar1;
        for (uVar19 = (long)puVar6 + (-6 - (long)__src); 7 < uVar19; uVar19 = uVar19 - 8) {
          uVar2 = *puVar13;
          uVar3 = *puVar12;
          if (uVar2 == uVar3) {
            puVar12 = puVar12 + 1;
          }
          else {
            uVar23 = 0;
            if ((uVar3 ^ uVar2) != 0) {
              for (; ((uVar3 ^ uVar2) >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
              }
            }
            uVar23 = (long)puVar12 + ((uVar23 >> 3 & 0x1fffffff) - (long)puVar1);
          }
          if (uVar2 != uVar3) goto LAB_01c5137d;
          puVar13 = puVar13 + 1;
        }
        puVar16 = puVar12;
        if (uVar19 != 0) {
          puVar16 = (ulong *)((long)puVar12 + uVar19);
          uVar23 = 0;
          do {
            if (*(char *)((long)puVar12 + uVar23) != *(char *)((long)puVar13 + uVar23)) {
              puVar16 = (ulong *)((long)puVar12 + uVar23);
              break;
            }
            uVar23 = uVar23 + 1;
          } while (uVar19 != uVar23);
        }
        uVar23 = (long)puVar16 - (long)puVar1;
LAB_01c5137d:
        uVar19 = uVar23 + 6;
        if (uVar19 < 10) {
          uVar9 = (int)uVar19 + 0x26;
        }
        else {
          uVar9 = (uint)uVar23;
          if (uVar19 < 0x86) {
            uVar4 = 0x1f;
            if (uVar9 != 0) {
              for (; uVar9 >> uVar4 == 0; uVar4 = uVar4 - 1) {
              }
            }
            bVar8 = (char)(uVar4 ^ 0xffffffe0) + 0x1f;
            uVar19 = uVar23 >> (bVar8 & 0x3f);
            uVar9 = (uVar9 - (int)(uVar19 << (bVar8 & 0x3f))) * 0x100 |
                    (int)uVar19 + (uVar4 ^ 0xffffffe0) * 2 + 0x6a;
          }
          else if (uVar19 < 0x846) {
            iVar11 = 0x1f;
            if (uVar9 - 0x40 != 0) {
              for (; uVar9 - 0x40 >> iVar11 == 0; iVar11 = iVar11 + -1) {
              }
            }
            uVar9 = iVar11 + ((int)(-1L << ((byte)iVar11 & 0x3f)) + uVar9 + -0x40) * 0x100 + 0x34;
          }
          else {
            uVar9 = (int)uVar19 * 0x100 - 0x845c1;
          }
        }
        puVar14 = (uint *)((long)__src + uVar23 + 6);
        *local_98 = uVar9;
        uVar4 = iVar10 + 3;
        uVar9 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        bVar8 = 0x1e - (char)(uVar9 ^ 0x1f);
        bVar24 = (uVar4 >> (bVar8 & 0x1f) & 1) != 0;
        local_98[1] = (uint)bVar24 +
                      ((uVar4 - (bVar24 + 2 << (bVar8 & 0x1f))) * 0x100 | (uVar9 ^ 0x1f) * 2 ^ 0x3e)
                      + 0x4c;
        if (puVar14 < puVar18) {
          uVar19 = *(ulong *)((long)__src + uVar23 + 1);
          iVar11 = (int)puVar14 - iVar21;
          *(int *)(literal_buf + (uVar19 * 0x1e35a7bd0000 >> 0x30) * 4) = iVar11 + -5;
          *(int *)(literal_buf + ((uVar19 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x30) * 4) =
               iVar11 + -4;
          *(int *)(literal_buf + ((uVar19 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x30) * 4) =
               iVar11 + -3;
          uVar23 = *(ulong *)((long)__src + uVar23 + 4);
          uVar19 = (uVar23 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x30;
          *(int *)(literal_buf + (uVar23 * 0x1e35a7bd0000 >> 0x30) * 4) = iVar11 + -2;
          *(int *)(literal_buf + ((uVar23 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x30) * 4) =
               iVar11 + -1;
          puVar20 = (uint *)(input + *(int *)(literal_buf + uVar19 * 4));
          *(int *)(literal_buf + uVar19 * 4) = iVar11;
          uVar23 = 0;
        }
        else {
          uVar23 = 7;
        }
        local_98 = local_98 + 2;
        local_9c = iVar10;
        if (puVar18 <= puVar14) goto LAB_01c5152d;
        lVar7 = (long)puVar14 - (long)puVar20;
        __src = puVar14;
        if ((0x3fff0 < lVar7) || (uVar23 = (ulong)*puVar14, *puVar14 != *puVar20)) break;
      }
    }
    puVar14 = (uint *)((long)__src + 1);
    uVar22 = (ulong)(*(long *)((long)__src + 1) * 0x1e35a7bd0000) >> 0x30;
    iVar11 = 0;
  }
  else {
LAB_01c5152d:
    iVar11 = (int)uVar23;
    __src = puVar14;
  }
LAB_01c51551:
  if (iVar11 != 0) goto LAB_01c51573;
  goto LAB_01c50ecf;
}

Assistant:

void duckdb_brotli::BrotliCompressFragmentTwoPass(
    BrotliTwoPassArena* s, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          s, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    RewindBitPosition(initial_storage_ix, storage_ix, storage);
    EmitUncompressedMetaBlock(input, input_size, storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}